

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsdTree.c
# Opt level: O0

void Dsd_TreePrint2_rec(FILE *pFile,DdManager *dd,Dsd_Node_t *pNode,int fComp,char **pInputNames)

{
  char *pcVar1;
  Dsd_Node_t *pInput;
  word uTruth;
  DdNode *bFunc;
  int uCanonPhase;
  undefined1 auStack_34 [2];
  char pCanonPerm [6];
  int i;
  char **pInputNames_local;
  int fComp_local;
  Dsd_Node_t *pNode_local;
  DdManager *dd_local;
  FILE *pFile_local;
  
  unique0x10000541 = pInputNames;
  if (pNode->Type == DSD_NODE_CONST1) {
    fprintf((FILE *)pFile,"Const%d",(ulong)((fComp != 0 ^ 0xffU) & 1));
  }
  else {
    if ((((pNode->Type != DSD_NODE_BUF) && (pNode->Type != DSD_NODE_PRIME)) &&
        (pNode->Type != DSD_NODE_OR)) && (pNode->Type != DSD_NODE_EXOR)) {
      __assert_fail("pNode->Type == DSD_NODE_BUF || pNode->Type == DSD_NODE_PRIME || pNode->Type == DSD_NODE_OR || pNode->Type == DSD_NODE_EXOR"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bdd/dsd/dsdTree.c"
                    ,0x35d,
                    "void Dsd_TreePrint2_rec(FILE *, DdManager *, Dsd_Node_t *, int, char **)");
    }
    if (pNode->Type == DSD_NODE_BUF) {
      pcVar1 = "";
      if (fComp != 0) {
        pcVar1 = "!";
      }
      fprintf((FILE *)pFile,"%s",pcVar1);
      fprintf((FILE *)pFile,"%s",stack0xffffffffffffffd0[pNode->S->index]);
    }
    else if (pNode->Type == DSD_NODE_PRIME) {
      fprintf((FILE *)pFile," ");
      if (pNode->nDecs < 7) {
        uTruth = (word)Dsd_TreeGetPrimeFunction(dd,pNode);
        pInput = (Dsd_Node_t *)Dsd_TreeFunc2Truth_rec(dd,(DdNode *)uTruth);
        Cudd_Ref((DdNode *)uTruth);
        Cudd_RecursiveDeref(dd,(DdNode *)uTruth);
        bFunc._0_4_ = Abc_TtCanonicize((word *)&pInput,(int)pNode->nDecs,(char *)((long)&bFunc + 6))
        ;
        pcVar1 = "";
        if (fComp != ((int)(uint)bFunc >> ((byte)pNode->nDecs & 0x1f) & 1U)) {
          pcVar1 = "!";
        }
        fprintf((FILE *)pFile,"%s",pcVar1);
        Abc_TtPrintHexRev(pFile,(word *)&pInput,(int)pNode->nDecs);
        fprintf((FILE *)pFile,"{");
        for (_auStack_34 = 0; _auStack_34 < pNode->nDecs; _auStack_34 = _auStack_34 + 1) {
          Dsd_TreePrint2_rec(pFile,dd,(Dsd_Node_t *)
                                      ((ulong)pNode->pDecs
                                              [(int)*(char *)((long)&bFunc + (long)_auStack_34 + 6)]
                                      & 0xfffffffffffffffe),
                             (uint)pNode->pDecs
                                   [(int)*(char *)((long)&bFunc + (long)_auStack_34 + 6)] & 1 ^
                             (int)(uint)bFunc >> ((byte)_auStack_34 & 0x1f) & 1U,
                             stack0xffffffffffffffd0);
        }
        fprintf((FILE *)pFile,"} ");
      }
      else {
        fprintf((FILE *)pFile,"|%d|",(ulong)(uint)(int)pNode->nDecs);
        fprintf((FILE *)pFile,"{");
        for (_auStack_34 = 0; _auStack_34 < pNode->nDecs; _auStack_34 = _auStack_34 + 1) {
          Dsd_TreePrint2_rec(pFile,dd,(Dsd_Node_t *)
                                      ((ulong)pNode->pDecs[_auStack_34] & 0xfffffffffffffffe),
                             (uint)pNode->pDecs[_auStack_34] & 1,stack0xffffffffffffffd0);
        }
        fprintf((FILE *)pFile,"} ");
      }
    }
    else if (pNode->Type == DSD_NODE_OR) {
      pcVar1 = "";
      if (fComp == 0) {
        pcVar1 = "!";
      }
      fprintf((FILE *)pFile,"%s",pcVar1);
      fprintf((FILE *)pFile,"(");
      for (_auStack_34 = 0; _auStack_34 < pNode->nDecs; _auStack_34 = _auStack_34 + 1) {
        Dsd_TreePrint2_rec(pFile,dd,(Dsd_Node_t *)
                                    ((ulong)pNode->pDecs[_auStack_34] & 0xfffffffffffffffe),
                           (uint)((((ulong)pNode->pDecs[_auStack_34] & 1) != 0 ^ 0xffU) & 1),
                           stack0xffffffffffffffd0);
      }
      fprintf((FILE *)pFile,")");
    }
    else if (pNode->Type == DSD_NODE_EXOR) {
      pcVar1 = "";
      if (fComp != 0) {
        pcVar1 = "!";
      }
      fprintf((FILE *)pFile,"%s",pcVar1);
      fprintf((FILE *)pFile,"[");
      for (_auStack_34 = 0; _auStack_34 < pNode->nDecs; _auStack_34 = _auStack_34 + 1) {
        Dsd_TreePrint2_rec(pFile,dd,(Dsd_Node_t *)
                                    ((ulong)pNode->pDecs[_auStack_34] & 0xfffffffffffffffe),
                           (uint)pNode->pDecs[_auStack_34] & 1,stack0xffffffffffffffd0);
      }
      fprintf((FILE *)pFile,"]");
    }
  }
  return;
}

Assistant:

void Dsd_TreePrint2_rec( FILE * pFile, DdManager * dd, Dsd_Node_t * pNode, int fComp, char * pInputNames[] )
{
    int i;
    if ( pNode->Type == DSD_NODE_CONST1 )
    {
        fprintf( pFile, "Const%d", !fComp );
        return;
    }
    assert( pNode->Type == DSD_NODE_BUF || pNode->Type == DSD_NODE_PRIME || pNode->Type == DSD_NODE_OR || pNode->Type == DSD_NODE_EXOR ); 
//    fprintf( pFile, "%s", (fComp ^ (pNode->Type == DSD_NODE_OR))? "!" : "" );
    if ( pNode->Type == DSD_NODE_BUF )
    {
        fprintf( pFile, "%s", fComp? "!" : "" );
        fprintf( pFile, "%s", pInputNames[pNode->S->index] );
    }
    else if ( pNode->Type == DSD_NODE_PRIME )
    {
        fprintf( pFile, " " );
        if ( pNode->nDecs <= 6 )
        {
            char pCanonPerm[6]; int uCanonPhase;
            // compute truth table
            DdNode * bFunc = Dsd_TreeGetPrimeFunction( dd, pNode );  
            word uTruth = Dsd_TreeFunc2Truth_rec( dd, bFunc );
            Cudd_Ref( bFunc );
            Cudd_RecursiveDeref( dd, bFunc );
            // canonicize truth table
            uCanonPhase = Abc_TtCanonicize( &uTruth, pNode->nDecs, pCanonPerm );
            fprintf( pFile, "%s", (fComp ^ ((uCanonPhase >> pNode->nDecs) & 1)) ? "!" : "" );
            Abc_TtPrintHexRev( pFile, &uTruth, pNode->nDecs );
            fprintf( pFile, "{" );
            for ( i = 0; i < pNode->nDecs; i++ )
            {
                Dsd_Node_t * pInput = pNode->pDecs[(int)pCanonPerm[i]];
                Dsd_TreePrint2_rec( pFile, dd, Dsd_Regular(pInput), Dsd_IsComplement(pInput) ^ ((uCanonPhase>>i)&1), pInputNames );
            }
            fprintf( pFile, "} " );
        }
        else
        {
            fprintf( pFile, "|%d|", pNode->nDecs );
            fprintf( pFile, "{" );
            for ( i = 0; i < pNode->nDecs; i++ )
                Dsd_TreePrint2_rec( pFile, dd, Dsd_Regular(pNode->pDecs[i]), Dsd_IsComplement(pNode->pDecs[i]), pInputNames );
            fprintf( pFile, "} " );
        }
    }
    else if ( pNode->Type == DSD_NODE_OR )
    {
        fprintf( pFile, "%s", !fComp? "!" : "" );
        fprintf( pFile, "(" );
        for ( i = 0; i < pNode->nDecs; i++ )
            Dsd_TreePrint2_rec( pFile, dd, Dsd_Regular(pNode->pDecs[i]), !Dsd_IsComplement(pNode->pDecs[i]), pInputNames );
        fprintf( pFile, ")" );
    }
    else if ( pNode->Type == DSD_NODE_EXOR )
    {
        fprintf( pFile, "%s", fComp? "!" : "" );
        fprintf( pFile, "[" );
        for ( i = 0; i < pNode->nDecs; i++ )
            Dsd_TreePrint2_rec( pFile, dd, Dsd_Regular(pNode->pDecs[i]), Dsd_IsComplement(pNode->pDecs[i]), pInputNames );
        fprintf( pFile, "]" );
    }
}